

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O1

void __thiscall QThread::setStackSize(QThread *this,uint stackSize)

{
  qsizetype *this_00;
  qsizetype *pqVar1;
  long lVar2;
  void *copy;
  QObjectData *pQVar3;
  
  pQVar3 = (this->super_QObject).d_ptr.d;
  this_00 = &pQVar3[1].children.d.size;
  if (pQVar3[1].children.d.size == 0) {
    LOCK();
    lVar2 = *this_00;
    if (lVar2 == 0) {
      *this_00 = 1;
    }
    UNLOCK();
    if (lVar2 == 0) goto LAB_00347045;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this_00);
LAB_00347045:
  *(uint *)&pQVar3[1].bindingStorage.d = stackSize;
  LOCK();
  pqVar1 = &pQVar3[1].children.d.size;
  copy = (void *)*pqVar1;
  *pqVar1 = 0;
  UNLOCK();
  if (copy != (void *)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
    return;
  }
  return;
}

Assistant:

void QThread::setStackSize(uint stackSize)
{
    Q_D(QThread);
    Q_ASSERT_X(!isRunning(), "QThread::setStackSize",
               "cannot change stack size while the thread is running");
    QMutexLocker locker(&d->mutex);
    d->stackSize = stackSize;
}